

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sundials_direct.c
# Opt level: O0

realtype ** newDenseMat(sunindextype m,sunindextype n)

{
  void *pvVar1;
  realtype **a;
  sunindextype j;
  sunindextype n_local;
  sunindextype m_local;
  
  if ((n < 1) || (m < 1)) {
    m_local = 0;
  }
  else {
    m_local = (sunindextype)malloc(n << 3);
    if ((long *)m_local == (long *)0x0) {
      m_local = 0;
    }
    else {
      *(long *)m_local = 0;
      pvVar1 = malloc(m * n * 8);
      *(void **)m_local = pvVar1;
      if (*(long *)m_local == 0) {
        free((void *)m_local);
        m_local = 0;
      }
      else {
        for (a = (realtype **)0x1; (long)a < n; a = (realtype **)((long)a + 1)) {
          *(long *)(m_local + a * 8) = *(long *)m_local + (long)a * m * 8;
        }
      }
    }
  }
  return (realtype **)m_local;
}

Assistant:

realtype **newDenseMat(sunindextype m, sunindextype n)
{
  sunindextype j;
  realtype **a;

  if ( (n <= 0) || (m <= 0) ) return(NULL);

  a = NULL;
  a = (realtype **) malloc(n * sizeof(realtype *));
  if (a == NULL) return(NULL);

  a[0] = NULL;
  a[0] = (realtype *) malloc(m * n * sizeof(realtype));
  if (a[0] == NULL) {
    free(a); a = NULL;
    return(NULL);
  }

  for (j=1; j < n; j++) a[j] = a[0] + j * m;

  return(a);
}